

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O1

void av1_pick_uniform_tx_size_type_yrd
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,BLOCK_SIZE bs,int64_t ref_best_rd)

{
  MB_RD_INFO *pMVar1;
  uint8_t *__src;
  _Bool _Var2;
  _Bool _Var3;
  byte bVar4;
  MB_MODE_INFO *pMVar5;
  MB_MODE_INFO *pMVar6;
  MB_MODE_INFO *pMVar7;
  undefined8 uVar8;
  int64_t iVar9;
  int64_t iVar10;
  undefined7 uVar11;
  size_t __n;
  uint32_t uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int (*paiVar16) [2];
  byte bVar17;
  int iVar18;
  int64_t iVar19;
  bool bVar20;
  int iVar21;
  uint uVar22;
  undefined1 *puVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  byte bVar27;
  TX_SIZE TVar28;
  MB_RD_RECORD *pMVar29;
  long lVar30;
  int iVar31;
  byte bVar32;
  long lVar33;
  long current_rd;
  byte bVar34;
  byte bVar35;
  long lVar36;
  bool bVar37;
  byte local_925;
  MB_MODE_INFO *mbmi;
  RD_STATS local_8b8;
  int (*local_890) [3] [5];
  int (*local_888) [2];
  MB_MODE_INFO *local_880;
  size_t local_878;
  uint8_t *local_870;
  long local_868;
  int64_t dist;
  int64_t rd [3];
  uint8_t best_blk_skip [1024];
  uint8_t best_txk_type_map [1024];
  
  pMVar5 = *(x->e_mbd).mi;
  bVar20 = true;
  if ((pMVar5->field_0xa7 & 0x80) == 0) {
    bVar20 = '\0' < pMVar5->ref_frame[0];
  }
  iVar14 = (x->e_mbd).mi_row;
  iVar18 = (x->e_mbd).mi_col;
  pMVar29 = (MB_RD_RECORD *)0x0;
  rd_stats->rate = 0;
  rd_stats->zero_rate = 0;
  rd_stats->dist = 0;
  rd_stats->rdcost = 0;
  rd_stats->sse = 0;
  rd_stats->skip_txfm = '\x01';
  iVar31 = 1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[bs] - 4 & 0x1f);
  uVar12 = 0;
  if (bVar20) {
    if ((cpi->sf).rd_sf.use_mb_rd_hash == 0) {
      pMVar29 = (MB_RD_RECORD *)0x0;
    }
    else {
      bVar37 = true;
      if ((((iVar14 < (x->e_mbd).tile.mi_row_start) ||
           ((x->e_mbd).tile.mi_row_end <=
            (int)(iVar14 + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                 [bs]))) || (iVar18 < (x->e_mbd).tile.mi_col_start)) ||
         ((x->e_mbd).tile.mi_col_end <=
          (int)(iVar18 + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                               [bs]))) {
        pMVar29 = (MB_RD_RECORD *)0x0;
        uVar12 = 0;
      }
      else {
        uVar12 = (*av1_get_crc32c_value)
                           (&((x->txfm_search_info).mb_rd_record)->crc_calculator,
                            (uint8_t *)x->plane[0].src_diff,
                            (ulong)block_size_wide[bs] * (ulong)block_size_high[bs] * 2);
        uVar12 = uVar12 * 0x20 + (uint)bs;
        pMVar29 = (x->txfm_search_info).mb_rd_record;
        iVar14 = -1;
        if ((ref_best_rd != 0x7fffffffffffffff) && (iVar18 = pMVar29->num, 0 < iVar18)) {
          iVar21 = pMVar29->index_start;
          do {
            iVar18 = iVar18 + -1;
            iVar14 = iVar21 % 8;
            if (pMVar29->mb_rd_info[iVar21 % 8].hash_value == uVar12) break;
            iVar21 = iVar21 + 1;
            iVar14 = -1;
          } while (iVar18 != 0);
        }
        bVar37 = iVar14 == -1;
        if (!bVar37) {
          pMVar6 = *(x->e_mbd).mi;
          __src = pMVar29->mb_rd_info[iVar14].blk_skip;
          pMVar6->tx_size = ((MB_RD_INFO *)(__src + -0x11))->tx_size;
          memcpy((x->txfm_search_info).blk_skip,__src,(long)iVar31);
          uVar8 = *(undefined8 *)(__src + -8);
          *(undefined8 *)pMVar6->inter_tx_size = *(undefined8 *)(__src + -0x10);
          *(undefined8 *)(pMVar6->inter_tx_size + 8) = uVar8;
          memcpy((x->e_mbd).tx_type_map,pMVar29->mb_rd_info[iVar14].tx_type_map,(long)iVar31);
          iVar18 = pMVar29->mb_rd_info[iVar14].rd_stats.zero_rate;
          iVar19 = pMVar29->mb_rd_info[iVar14].rd_stats.dist;
          iVar9 = pMVar29->mb_rd_info[iVar14].rd_stats.rdcost;
          iVar10 = pMVar29->mb_rd_info[iVar14].rd_stats.sse;
          rd_stats->rate = pMVar29->mb_rd_info[iVar14].rd_stats.rate;
          rd_stats->zero_rate = iVar18;
          rd_stats->dist = iVar19;
          rd_stats->rdcost = iVar9;
          rd_stats->sse = iVar10;
          uVar11 = *(undefined7 *)&pMVar29->mb_rd_info[iVar14].rd_stats.field_0x21;
          rd_stats->skip_txfm = pMVar29->mb_rd_info[iVar14].rd_stats.skip_txfm;
          *(undefined7 *)&rd_stats->field_0x21 = uVar11;
        }
      }
      if (!bVar37) {
        return;
      }
    }
  }
  if (((!(bool)(bVar20 ^ 1U | (x->txfm_search_params).skip_txfm_level == 0)) &&
      ((x->e_mbd).lossless[*(ushort *)&pMVar5->field_0xa7 & 7] == 0)) &&
     (iVar14 = predict_skip_txfm(x,bs,&dist,(uint)(cpi->common).features.reduced_tx_set_used),
     iVar14 != 0)) {
    set_skip_txfm(x,rd_stats,bs,dist);
    goto LAB_00249238;
  }
  if ((x->e_mbd).lossless[*(ushort *)&pMVar5->field_0xa7 & 7] != 0) {
    (*(x->e_mbd).mi)->tx_size = '\0';
    av1_txfm_rd_in_plane(x,cpi,rd_stats,ref_best_rd,0,0,bs,'\0','\0',0);
    goto LAB_00249238;
  }
  if ((x->txfm_search_params).tx_size_search_method != '\x02') {
    rd_stats->rate = 0x7fffffff;
    rd_stats->zero_rate = 0;
    rd_stats->dist = 0x7fffffffffffffff;
    rd_stats->rdcost = 0x7fffffffffffffff;
    rd_stats->sse = 0x7fffffffffffffff;
    rd_stats->skip_txfm = '\0';
    local_880 = *(x->e_mbd).mi;
    bVar17 = ""[bs];
    uVar25 = (ulong)bVar17;
    uVar15 = (ulong)(x->txfm_search_params).tx_mode_search_type;
    if (uVar15 == 2) {
      if ((local_880->field_0xa7 & 0x80) == 0) {
        bVar20 = local_880->ref_frame[0] < '\x01';
      }
      else {
        bVar20 = false;
      }
      if ((2 < (byte)(bs - BLOCK_64X128)) ||
         (iVar14 = 2, (cpi->sf).tx_sf.tx_size_search_lgr_block == 0)) {
        iVar14 = *(int *)((long)&((TX_SPEED_FEATURES *)(&(cpi->sf).intra_sf + 1))->
                                 inter_tx_size_search_init_depth_sqr +
                         (ulong)((uint)bVar20 * 8 +
                                (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                       [bs] != "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                               [bs]) * 4));
      }
      if (iVar14 == 2) {
        iVar14 = 2;
        if (((cpi->oxcf).txfm_cfg.enable_tx64 == false) && ((0x61810UL >> (uVar25 & 0x3f) & 1) != 0)
           ) {
          uVar25 = (ulong)""[uVar25];
        }
        else {
          uVar25 = (ulong)bVar17;
        }
      }
    }
    else {
      bVar35 = ""[uVar15];
      if (bs == BLOCK_4X4) {
        if (""[bs] < bVar35) {
          bVar35 = ""[bs];
        }
        uVar25 = (ulong)bVar35;
        iVar14 = 2;
      }
      else {
        bVar32 = bVar17;
        if (bVar35 < ""[uVar25]) {
          bVar32 = bVar35;
        }
        iVar14 = 2;
        uVar25 = (ulong)bVar32;
      }
    }
    x->rd_model = '\0';
    rd[0] = 0x7fffffffffffffff;
    rd[1] = 0x7fffffffffffffff;
    rd[2] = 0x7fffffffffffffff;
    local_925 = bVar17;
    if (iVar14 < 3) {
      local_888 = (x->mode_costs).txfm_partition_cost;
      local_890 = (x->mode_costs).tx_size_cost;
      local_870 = (x->txfm_search_info).blk_skip;
      local_878 = (size_t)iVar31;
      lVar33 = (long)iVar14;
      iVar14 = (int)uVar25;
      lVar24 = 0x7fffffffffffffff;
      local_868 = lVar33;
      do {
        iVar18 = (int)uVar25;
        if ((((cpi->oxcf).txfm_cfg.enable_tx64 != false) ||
            ((0x61810UL >> (uVar25 & 0x3f) & 1) == 0)) &&
           (((cpi->oxcf).txfm_cfg.enable_rect_tx != false ||
            (tx_size_wide[uVar25] == tx_size_high[uVar25])))) {
          if ((x->txfm_search_params).nn_prune_depths_for_intra_tx == '\x02') break;
          (x->txfm_search_params).enable_nn_prune_intra_tx_depths =
               (_Bool)(iVar18 == iVar14 & (cpi->sf).tx_sf.prune_intra_tx_depths_using_nn);
          iVar19 = ref_best_rd;
          if (lVar24 < ref_best_rd) {
            iVar19 = lVar24;
          }
          if ((cpi->sf).tx_sf.use_rd_based_breakout_for_intra_tx_search == false) {
            iVar19 = ref_best_rd;
          }
          pMVar5 = *(x->e_mbd).mi;
          bVar20 = true;
          if ((pMVar5->field_0xa7 & 0x80) == 0) {
            bVar20 = '\0' < pMVar5->ref_frame[0];
          }
          iVar21 = 0;
          bVar35 = (byte)uVar25;
          if (((x->txfm_search_params).tx_mode_search_type == '\x02') &&
             (uVar15 = (ulong)pMVar5->bsize, uVar15 != 0)) {
            bVar32 = *(x->e_mbd).above_txfm_context;
            uVar22 = (uint)bVar32;
            bVar4 = *(x->e_mbd).left_txfm_context;
            uVar13 = (uint)bVar4;
            if (iVar18 == 0) {
              lVar36 = 0;
            }
            else {
              bVar27 = block_size_high[uVar15];
              if (block_size_high[uVar15] < block_size_wide[uVar15]) {
                bVar27 = block_size_wide[uVar15];
              }
              bVar34 = 1;
              if (bVar27 < 0x20) {
                if (bVar27 == 8) {
                  TVar28 = '\x01';
                  bVar37 = false;
                  bVar34 = 0;
                }
                else {
                  if (bVar27 != 0x10) goto LAB_00248dac;
                  TVar28 = '\x02';
LAB_00248d9f:
                  bVar37 = false;
                }
              }
              else {
                TVar28 = '\x04';
                bVar37 = false;
                if ((bVar27 != 0x80) && (bVar27 != 0x40)) {
                  if (bVar27 == 0x20) {
                    TVar28 = '\x03';
                    goto LAB_00248d9f;
                  }
LAB_00248dac:
                  bVar37 = true;
                  TVar28 = '\0';
                  bVar34 = 1;
                }
              }
              lVar36 = 0x3f;
              if (!bVar37) {
                lVar36 = (ulong)(byte)((bVar34 & ""[uVar25] != TVar28) + TVar28 * -2 + 8) * 3;
              }
              lVar36 = (ulong)(bVar4 < *(byte *)(tx_size_high + uVar25)) +
                       (ulong)(bVar32 < *(byte *)(tx_size_wide + uVar25)) + lVar36;
            }
            if (bVar20) {
              paiVar16 = local_888 + lVar36;
            }
            else {
              if (bs == BLOCK_4X4) goto LAB_00248f36;
              lVar36 = 0;
              for (bVar32 = bVar17; bVar32 != bVar35; bVar32 = ""[bVar32]) {
                lVar36 = lVar36 + 1;
              }
              _Var2 = (x->e_mbd).up_available;
              if ((_Var2 == true) &&
                 ((pMVar6 = (x->e_mbd).above_mbmi, (pMVar6->field_0xa7 & 0x80) != 0 ||
                  ('\0' < pMVar6->ref_frame[0])))) {
                uVar22 = (uint)block_size_wide[pMVar6->bsize];
              }
              _Var3 = (x->e_mbd).left_available;
              if ((_Var3 != false) &&
                 ((pMVar6 = (x->e_mbd).left_mbmi, (pMVar6->field_0xa7 & 0x80) != 0 ||
                  ('\0' < pMVar6->ref_frame[0])))) {
                uVar13 = (uint)block_size_high[pMVar6->bsize];
              }
              paiVar16 = (int (*) [2])
                         (local_890[(ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table
                                                 [bs] - 1]
                          [(ulong)(byte)(_Var2 & tx_size_wide[""[uVar15]] <= (int)uVar22) +
                           (ulong)(byte)(_Var3 & tx_size_high[""[uVar15]] <= (int)uVar13)] + lVar36)
              ;
            }
            iVar21 = (*paiVar16)[0];
          }
LAB_00248f36:
          pMVar6 = (x->e_mbd).left_mbmi;
          pMVar7 = (x->e_mbd).above_mbmi;
          if (pMVar7 == (MB_MODE_INFO *)0x0) {
            uVar22 = 0;
          }
          else {
            uVar22 = (uint)pMVar7->skip_txfm;
          }
          if (pMVar6 == (MB_MODE_INFO *)0x0) {
            uVar13 = 0;
          }
          else {
            uVar13 = (uint)pMVar6->skip_txfm;
          }
          lVar26 = (long)(x->mode_costs).skip_txfm_cost[uVar13 + uVar22][1];
          lVar36 = 0x7fffffffffffffff;
          if (bVar20) {
            lVar36 = x->rdmult * lVar26 + 0x100 >> 9;
          }
          lVar30 = (long)(x->mode_costs).skip_txfm_cost[uVar13 + uVar22][0] + (long)iVar21;
          current_rd = x->rdmult * lVar30 + 0x100 >> 9;
          pMVar5->tx_size = bVar35;
          if (lVar36 <= current_rd) {
            current_rd = lVar36;
          }
          av1_txfm_rd_in_plane(x,cpi,&local_8b8,iVar19,current_rd,0,bs,bVar35,'\0',0);
          __n = local_878;
          lVar36 = 0x7fffffffffffffff;
          if (local_8b8.rate != 0x7fffffff) {
            if (local_8b8.skip_txfm == '\0' || !bVar20) {
              lVar36 = local_8b8.dist * 0x80 +
                       ((long)x->rdmult * (long)((int)lVar30 + local_8b8.rate) + 0x100 >> 9);
              local_8b8.rate = iVar21 + local_8b8.rate;
            }
            else {
              lVar36 = local_8b8.sse * 0x80 + (x->rdmult * lVar26 + 0x100 >> 9);
            }
            if (((local_8b8.skip_txfm == '\0' && bVar20) &&
                ((x->e_mbd).lossless[*(ushort *)&pMVar5->field_0xa7 & 7] == 0)) &&
               (lVar26 = local_8b8.sse * 0x80 + (x->rdmult * lVar26 + 0x100 >> 9), lVar26 <= lVar36)
               ) {
              local_8b8.rate = 0;
              local_8b8.dist = local_8b8.sse;
              local_8b8.skip_txfm = '\x01';
              lVar36 = lVar26;
            }
          }
          rd[lVar33] = lVar36;
          if (lVar36 < lVar24) {
            memcpy(best_blk_skip,local_870,local_878);
            memcpy(best_txk_type_map,(x->e_mbd).tx_type_map,__n);
            rd_stats->rate = local_8b8.rate;
            rd_stats->zero_rate = local_8b8.zero_rate;
            rd_stats->dist = local_8b8.dist;
            rd_stats->rdcost = local_8b8.rdcost;
            rd_stats->sse = local_8b8.sse;
            *(ulong *)&rd_stats->skip_txfm = CONCAT71(local_8b8._33_7_,local_8b8.skip_txfm);
            lVar24 = lVar36;
            local_925 = bVar35;
          }
          if ((iVar18 == 0) ||
             (((lVar33 != 2 && local_868 < lVar33 && (x->source_variance < 0x100)) &&
              (rd[lVar33 + -1] < lVar36)))) break;
        }
        lVar33 = lVar33 + 1;
        uVar25 = (ulong)""[uVar25];
      } while ((int)lVar33 != 3);
    }
    if (rd_stats->rate != 0x7fffffff) {
      local_880->tx_size = local_925;
      memcpy((x->e_mbd).tx_type_map,best_txk_type_map,(long)iVar31);
      memcpy((x->txfm_search_info).blk_skip,best_blk_skip,(long)iVar31);
    }
    (x->txfm_search_params).nn_prune_depths_for_intra_tx = '\0';
    (x->txfm_search_params).enable_nn_prune_intra_tx_depths = false;
    goto LAB_00249238;
  }
  pMVar5 = *(x->e_mbd).mi;
  bVar17 = ""[(x->txfm_search_params).tx_mode_search_type];
  if (bs == BLOCK_4X4) {
    if (""[bs] < bVar17) {
      bVar17 = ""[bs];
    }
  }
  else if (""[""[bs]] <= bVar17) {
    bVar17 = ""[bs];
  }
  pMVar5->tx_size = bVar17;
  _Var2 = (cpi->oxcf).txfm_cfg.enable_tx64;
  _Var3 = (cpi->oxcf).txfm_cfg.enable_rect_tx;
  if (_Var2 == false) {
    if (_Var3 == false) {
LAB_002489f4:
      if ((cpi->oxcf).txfm_cfg.enable_rect_tx != false) goto LAB_00248a8d;
      puVar23 = choose_largest_tx_size_tx_size_max_32_square;
    }
    else {
      puVar23 = choose_largest_tx_size_tx_size_max_32;
    }
LAB_00248a81:
    pMVar5->tx_size = puVar23[bVar17];
  }
  else {
    if (_Var3 == false) {
      puVar23 = "";
      goto LAB_00248a81;
    }
    if (_Var2 == false) goto LAB_002489f4;
  }
LAB_00248a8d:
  pMVar6 = (x->e_mbd).left_mbmi;
  pMVar7 = (x->e_mbd).above_mbmi;
  if (pMVar7 == (MB_MODE_INFO *)0x0) {
    uVar22 = 0;
  }
  else {
    uVar22 = (uint)pMVar7->skip_txfm;
  }
  if (pMVar6 == (MB_MODE_INFO *)0x0) {
    uVar13 = 0;
  }
  else {
    uVar13 = (uint)pMVar6->skip_txfm;
  }
  if (((pMVar5->field_0xa7 & 0x80) == 0) && (pMVar5->ref_frame[0] < '\x01')) {
    lVar24 = 0x7fffffffffffffff;
  }
  else {
    lVar24 = (long)x->rdmult * (long)(x->mode_costs).skip_txfm_cost[uVar13 + uVar22][1] + 0x100 >> 9
    ;
  }
  lVar33 = (long)x->rdmult * (long)(x->mode_costs).skip_txfm_cost[uVar13 + uVar22][0] + 0x100 >> 9;
  if (lVar24 <= lVar33) {
    lVar33 = lVar24;
  }
  av1_txfm_rd_in_plane(x,cpi,rd_stats,ref_best_rd,lVar33,0,bs,pMVar5->tx_size,'\0',0);
LAB_00249238:
  if (pMVar29 != (MB_RD_RECORD *)0x0) {
    iVar14 = pMVar29->index_start;
    iVar18 = pMVar29->num;
    if (iVar18 < 8) {
      uVar13 = iVar14 + iVar18;
      uVar22 = iVar14 + iVar18 + 7;
      if (-1 < (int)uVar13) {
        uVar22 = uVar13;
      }
      iVar14 = uVar13 - (uVar22 & 0xfffffff8);
      pMVar29->num = iVar18 + 1;
    }
    else {
      uVar22 = iVar14 + 8;
      if (-1 < (int)(iVar14 + 1U)) {
        uVar22 = iVar14 + 1U;
      }
      pMVar29->index_start = (iVar14 - (uVar22 & 0xfffffff8)) + 1;
    }
    pMVar5 = *(x->e_mbd).mi;
    pMVar1 = pMVar29->mb_rd_info + iVar14;
    pMVar1->hash_value = uVar12;
    pMVar1->tx_size = pMVar5->tx_size;
    memcpy(pMVar1->blk_skip,(x->txfm_search_info).blk_skip,(long)iVar31);
    uVar8 = *(undefined8 *)(pMVar5->inter_tx_size + 8);
    *(undefined8 *)pMVar1->inter_tx_size = *(undefined8 *)pMVar5->inter_tx_size;
    *(undefined8 *)(pMVar1->inter_tx_size + 8) = uVar8;
    memcpy(pMVar29->mb_rd_info[iVar14].tx_type_map,(x->e_mbd).tx_type_map,(long)iVar31);
    iVar18 = rd_stats->zero_rate;
    iVar19 = rd_stats->dist;
    iVar9 = rd_stats->rdcost;
    iVar10 = rd_stats->sse;
    pMVar29->mb_rd_info[iVar14].rd_stats.rate = rd_stats->rate;
    pMVar29->mb_rd_info[iVar14].rd_stats.zero_rate = iVar18;
    pMVar29->mb_rd_info[iVar14].rd_stats.dist = iVar19;
    pMVar29->mb_rd_info[iVar14].rd_stats.rdcost = iVar9;
    pMVar29->mb_rd_info[iVar14].rd_stats.sse = iVar10;
    uVar11 = *(undefined7 *)&rd_stats->field_0x21;
    pMVar29->mb_rd_info[iVar14].rd_stats.skip_txfm = rd_stats->skip_txfm;
    *(undefined7 *)&pMVar29->mb_rd_info[iVar14].rd_stats.field_0x21 = uVar11;
  }
  return;
}

Assistant:

void av1_pick_uniform_tx_size_type_yrd(const AV1_COMP *const cpi, MACROBLOCK *x,
                                       RD_STATS *rd_stats, BLOCK_SIZE bs,
                                       int64_t ref_best_rd) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const TxfmSearchParams *tx_params = &x->txfm_search_params;
  assert(bs == mbmi->bsize);
  const int is_inter = is_inter_block(mbmi);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  av1_init_rd_stats(rd_stats);

  // Hashing based speed feature for inter blocks. If the hash of the residue
  // block is found in the table, use previously saved search results and
  // terminate early.
  uint32_t hash = 0;
  MB_RD_RECORD *mb_rd_record = NULL;
  const int num_blks = bsize_to_num_blk(bs);
  if (is_inter && cpi->sf.rd_sf.use_mb_rd_hash) {
    const int within_border =
        mi_row >= xd->tile.mi_row_start &&
        (mi_row + mi_size_high[bs] < xd->tile.mi_row_end) &&
        mi_col >= xd->tile.mi_col_start &&
        (mi_col + mi_size_wide[bs] < xd->tile.mi_col_end);
    if (within_border) {
      hash = get_block_residue_hash(x, bs);
      mb_rd_record = x->txfm_search_info.mb_rd_record;
      const int match_index = find_mb_rd_info(mb_rd_record, ref_best_rd, hash);
      if (match_index != -1) {
        MB_RD_INFO *mb_rd_info = &mb_rd_record->mb_rd_info[match_index];
        fetch_mb_rd_info(num_blks, mb_rd_info, rd_stats, x);
        return;
      }
    }
  }

  // If we predict that skip is the optimal RD decision - set the respective
  // context and terminate early.
  int64_t dist;
  if (tx_params->skip_txfm_level && is_inter &&
      !xd->lossless[mbmi->segment_id] &&
      predict_skip_txfm(x, bs, &dist,
                        cpi->common.features.reduced_tx_set_used)) {
    // Populate rdstats as per skip decision
    set_skip_txfm(x, rd_stats, bs, dist);
    // Save the RD search results into mb_rd_record.
    if (mb_rd_record) {
      save_mb_rd_info(num_blks, hash, x, rd_stats, mb_rd_record);
    }
    return;
  }

  if (xd->lossless[mbmi->segment_id]) {
    // Lossless mode can only pick the smallest (4x4) transform size.
    choose_smallest_tx_size(cpi, x, rd_stats, ref_best_rd, bs);
  } else if (tx_params->tx_size_search_method == USE_LARGESTALL) {
    choose_largest_tx_size(cpi, x, rd_stats, ref_best_rd, bs);
  } else {
    choose_tx_size_type_from_rd(cpi, x, rd_stats, ref_best_rd, bs);
  }

  // Save the RD search results into mb_rd_record for possible reuse in future.
  if (mb_rd_record) {
    save_mb_rd_info(num_blks, hash, x, rd_stats, mb_rd_record);
  }
}